

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

bool __thiscall
booster::locale::gnu_gettext::mo_message<char>::load_file
          (mo_message<char> *this,string *file_name,string *locale_encoding,string *key_encoding,
          int id,callback_type *callback)

{
  bool bVar1;
  int iVar3;
  char *pcVar4;
  undefined1 uVar2;
  ulong uVar5;
  undefined8 uVar6;
  type this_00;
  pointer this_01;
  size_t sVar7;
  string *in_RCX;
  string *in_RDX;
  char *in_RSI;
  long in_RDI;
  int in_R8D;
  pair_type pVar8;
  pair_type pVar9;
  string_type value;
  pair_type tmp;
  key_type key;
  string_type skey;
  char *ckey;
  uint i;
  converter<char> cvt_key;
  converter<char> cvt_value;
  unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
  ptr;
  string mo_encoding;
  string plural;
  c_file the_file;
  vector<char,_std::allocator<char>_> vfile;
  unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
  mo;
  undefined4 in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  message_key<char> *in_stack_fffffffffffffbf0;
  mo_file *in_stack_fffffffffffffbf8;
  runtime_error *in_stack_fffffffffffffc00;
  mo_message<char> *in_stack_fffffffffffffc08;
  mo_file *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  string *in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffc38;
  string *in_stack_fffffffffffffc40;
  allocator *paVar10;
  string *in_stack_fffffffffffffc48;
  int id_00;
  mo_message<char> *in_stack_fffffffffffffc50;
  string_type *c;
  string local_350 [32];
  pair_type local_330;
  string local_2d0 [32];
  char *local_2b0;
  uint local_2a4;
  string local_2a0 [32];
  string local_280 [96];
  string local_220 [32];
  string local_200 [110];
  undefined1 local_192;
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  undefined1 local_141;
  pair_type local_140;
  string local_130 [32];
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  pair_type local_c0;
  string local_b0 [32];
  string local_90 [32];
  c_file local_70;
  uint local_68;
  int local_2c;
  string *local_28;
  string *local_20;
  char *local_18;
  byte local_1;
  
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x88),in_RDX);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xa8),local_28);
  iVar3 = compare_encodings(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                            in_stack_fffffffffffffc40);
  id_00 = (int)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  *(bool *)(in_RDI + 200) = iVar3 != 0;
  std::
  unique_ptr<booster::locale::gnu_gettext::mo_file,std::default_delete<booster::locale::gnu_gettext::mo_file>>
  ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::mo_file>,void>
            ((unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
              *)in_stack_fffffffffffffbf0);
  bVar1 = std::function::operator_cast_to_bool
                    ((function<std::vector<char,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)in_stack_fffffffffffffbf0);
  if (bVar1) {
    std::
    function<std::vector<char,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<std::vector<char,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)in_stack_fffffffffffffc08,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbf8);
    bVar1 = std::vector<char,_std::allocator<char>_>::empty
                      ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc00);
    if (bVar1) {
      local_1 = 0;
    }
    else {
      operator_new(0x48);
      mo_file::mo_file(in_stack_fffffffffffffc10,
                       (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc08);
      std::
      unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
      ::reset((unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
               *)in_stack_fffffffffffffbf0,
              (pointer)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    }
    local_68 = (uint)bVar1;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc00);
    pVar8.second = local_330.second;
    pVar8.first = local_330.first;
  }
  else {
    c_file::c_file(&local_70);
    c_file::open(&local_70,local_18,(int)local_20);
    if (local_70.file != (FILE *)0x0) {
      operator_new(0x48);
      mo_file::mo_file(in_stack_fffffffffffffc10,(FILE *)in_stack_fffffffffffffc08);
      std::
      unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
      ::reset((unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
               *)in_stack_fffffffffffffbf0,
              (pointer)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    }
    else {
      local_1 = 0;
    }
    local_68 = (uint)(local_70.file == (FILE *)0x0);
    c_file::~c_file((c_file *)0x240a0e);
    pVar8.second = local_330.second;
    pVar8.first = local_330.first;
  }
  if (local_68 == 0) {
    std::
    unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
    ::operator->((unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                  *)0x240a61);
    local_c0 = mo_file::value((mo_file *)in_stack_fffffffffffffc50,id_00);
    pcVar4 = local_c0.first;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar4,&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"plural=",&local_e9);
    extract(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
            (char *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::
    unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
    ::operator->((unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                  *)0x240b7b);
    pVar8 = mo_file::value((mo_file *)in_stack_fffffffffffffc50,id_00);
    c = (string_type *)&local_141;
    local_140 = pVar8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,pVar8.first,(allocator *)c);
    paVar10 = &local_169;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"charset=",paVar10);
    extract(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
            (char *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      local_192 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      paVar10 = &local_191;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"Invalid mo-format, encoding is not specified",paVar10)
      ;
      runtime_error::runtime_error(in_stack_fffffffffffffc00,(string *)in_stack_fffffffffffffbf8);
      local_192 = 0;
      __cxa_throw(uVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::c_str();
      lambda::compile(in_stack_fffffffffffffc18);
      std::
      vector<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
      ::operator[]((vector<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
                    *)(in_RDI + 0x40),(long)local_2c);
      std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>::operator=
                ((shared_ptr<booster::locale::gnu_gettext::lambda::plural> *)
                 in_stack_fffffffffffffbf0,
                 (unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                  *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::
      unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
      ::~unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                     *)in_stack_fffffffffffffbf0);
    }
    this_00 = std::
              unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
              ::operator*((unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                           *)in_stack_fffffffffffffbf0);
    uVar2 = mo_useable_directly(in_stack_fffffffffffffc08,(string *)in_stack_fffffffffffffc00,
                                in_stack_fffffffffffffbf8);
    if ((bool)uVar2) {
      std::
      vector<std::shared_ptr<booster::locale::gnu_gettext::mo_file>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::mo_file>_>_>
      ::operator[]((vector<std::shared_ptr<booster::locale::gnu_gettext::mo_file>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::mo_file>_>_>
                    *)(in_RDI + 0x28),(long)local_2c);
      std::shared_ptr<booster::locale::gnu_gettext::mo_file>::operator=
                ((shared_ptr<booster::locale::gnu_gettext::mo_file> *)in_stack_fffffffffffffbf0,
                 (unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                  *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    }
    else {
      std::__cxx11::string::string(local_200,local_20);
      std::__cxx11::string::string(local_220,local_110);
      converter<char>::converter
                ((converter<char> *)in_stack_fffffffffffffc10,(string *)in_stack_fffffffffffffc08,
                 (string *)in_stack_fffffffffffffc00);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::string::string(local_280,local_28);
      std::__cxx11::string::string(local_2a0,local_110);
      converter<char>::converter
                ((converter<char> *)in_stack_fffffffffffffc10,(string *)in_stack_fffffffffffffc08,
                 (string *)in_stack_fffffffffffffc00);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_280);
      pVar9.second = (char *)in_stack_fffffffffffffbf8;
      pVar9.first = (char *)in_stack_fffffffffffffc00;
      local_2a4 = 0;
      while( true ) {
        uVar5 = (ulong)local_2a4;
        this_01 = std::
                  unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                  ::operator->((unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                                *)0x24107a);
        sVar7 = mo_file::size(this_01);
        if (sVar7 <= uVar5) break;
        std::
        unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
        ::operator->((unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                      *)0x2410a9);
        local_2b0 = mo_file::key((mo_file *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
        strlen(local_2b0);
        converter<char>::operator()[abi_cxx11_
                  ((converter<char> *)pVar9.second,(char *)in_stack_fffffffffffffbf0,
                   (char *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        message_key<char>::message_key((message_key<char> *)pVar8.second,c);
        std::
        unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
        ::operator->((unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                      *)0x241124);
        pVar9 = mo_file::value((mo_file *)pVar8.first,(int)((ulong)paVar10 >> 0x20));
        local_330 = pVar9;
        converter<char>::operator()[abi_cxx11_
                  ((converter<char> *)pVar9.second,(char *)in_stack_fffffffffffffbf0,
                   (char *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        std::
        vector<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::operator[]((vector<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)(in_RDI + 0x10),(long)local_2c);
        in_stack_fffffffffffffbf0 =
             (message_key<char> *)
             std::
             map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this_00,(key_type *)CONCAT17(uVar2,in_stack_fffffffffffffc28));
        std::__cxx11::string::swap((string *)in_stack_fffffffffffffbf0);
        std::__cxx11::string::~string(local_350);
        message_key<char>::~message_key(in_stack_fffffffffffffbf0);
        std::__cxx11::string::~string(local_2d0);
        local_2a4 = local_2a4 + 1;
      }
      converter<char>::~converter((converter<char> *)in_stack_fffffffffffffbf0);
      converter<char>::~converter((converter<char> *)in_stack_fffffffffffffbf0);
    }
    local_1 = 1;
    local_68 = 1;
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_90);
    pVar8 = local_330;
  }
  local_330 = pVar8;
  std::
  unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
  ::~unique_ptr((unique_ptr<booster::locale::gnu_gettext::mo_file,_std::default_delete<booster::locale::gnu_gettext::mo_file>_>
                 *)in_stack_fffffffffffffbf0);
  return (bool)(local_1 & 1);
}

Assistant:

bool load_file( std::string const &file_name,
                                std::string const &locale_encoding,
                                std::string const &key_encoding,
                                int id,
                                messages_info::callback_type const &callback)
                {
                    locale_encoding_ = locale_encoding;
                    key_encoding_ = key_encoding;
                    
                    key_conversion_required_ =  sizeof(CharType) == 1 
                                                && compare_encodings(locale_encoding,key_encoding)!=0;

                    std::unique_ptr<mo_file> mo;

                    if(callback) {
                        std::vector<char> vfile = callback(file_name,locale_encoding);
                        if(vfile.empty()) 
                            return false;
                        mo.reset(new mo_file(vfile));
                    }
                    else {
                        c_file the_file;
                        the_file.open(file_name,locale_encoding);
                        if(!the_file.file)
                            return false;
                        mo.reset(new mo_file(the_file.file));
                    }
                    
                    std::string plural = extract(mo->value(0).first,"plural=","\r\n;");

                    std::string mo_encoding = extract(mo->value(0).first,"charset="," \r\n;");

                    if(mo_encoding.empty())
                        throw booster::runtime_error("Invalid mo-format, encoding is not specified");

                    if(!plural.empty()) {
                        std::unique_ptr<lambda::plural> ptr=lambda::compile(plural.c_str());
                        plural_forms_[id] = std::move(ptr);
                    }

                    if( mo_useable_directly(mo_encoding,*mo) )
                    {
                        mo_catalogs_[id]=std::move(mo);
                    }
                    else {
                        converter<CharType> cvt_value(locale_encoding,mo_encoding);
                        converter<CharType> cvt_key(key_encoding,mo_encoding);
                        for(unsigned i=0;i<mo->size();i++) {
                            char const *ckey = mo->key(i);
                            string_type skey = cvt_key(ckey,ckey+strlen(ckey));
                            key_type key(skey);
                            
                            mo_file::pair_type tmp = mo->value(i);
                            string_type value = cvt_value(tmp.first,tmp.second);
                            catalogs_[id][key].swap(value);
                        }
                    }
                    return true;

                }